

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form8_Histogram(HistogramForm8 Histogram)

{
  ImageTemplate<unsigned_char> *this;
  uint8_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  bool bVar8;
  ushort uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  uint uVar16;
  undefined1 auVar17 [64];
  initializer_list<PenguinV_Image::ImageTemplate<unsigned_char>_> __l;
  uint32_t roiWidth;
  uint32_t roiHeight;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  Image local_50;
  
  Unit_Test::intensityArray(&intensity,2);
  uVar1 = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&roiY,0,0,'\x01','\x01');
  Test_Helper::uniformImage((Image *)&roiX,uVar1,0,0,(Image *)&roiY);
  uVar1 = intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[1];
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&histogram,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_50,uVar1,0,0,(Image *)&histogram);
  __l._M_len = 2;
  __l._M_array = (iterator)&roiX;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector(&image,__l,(allocator_type *)&roiWidth);
  lVar7 = 0x28;
  do {
    this = (ImageTemplate<unsigned_char> *)
           ((long)&roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar7);
    this->_vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(this);
    lVar7 = lVar7 + -0x28;
  } while (lVar7 != -0x28);
  histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)&histogram);
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)&roiY);
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Unit_Test::generateRoi(&image,&roiX,&roiY,&roiWidth,&roiHeight);
  bVar8 = true;
  if (roiHeight < 2) goto LAB_00151bde;
  Unit_Test::fillImage
            (image.
             super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1,
             roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1],
             roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1],roiWidth,roiHeight >> 1,0xff);
  Unit_Test::fillImage
            (image.
             super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1,
             roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1],
             (roiHeight >> 1) +
             roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1],roiWidth,roiHeight - (roiHeight >> 1),'\0');
  histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (*Histogram)(image.
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               *roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,
               *roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,
               image.
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1,
               roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[1],
               roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[1],roiWidth,roiHeight,&histogram);
  if ((long)histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start == 0x400) {
    bVar8 = false;
    uVar16 = 0;
    if (histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start
        [*intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start] == (roiHeight >> 1) * roiWidth) {
      if (histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        auVar11 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar17 = ZEXT1664((undefined1  [16])0x0);
        lVar7 = 0;
        auVar13 = vpbroadcastq_avx512f();
        auVar13 = vpsrlq_avx512f(auVar13,2);
        do {
          auVar14 = vpbroadcastq_avx512f();
          auVar15 = vmovdqa64_avx512f(auVar17);
          auVar17 = vporq_avx512f(auVar14,auVar11);
          auVar14 = vporq_avx512f(auVar14,auVar12);
          uVar4 = vpcmpuq_avx512f(auVar14,auVar13,2);
          bVar5 = (byte)uVar4;
          uVar4 = vpcmpuq_avx512f(auVar17,auVar13,2);
          bVar6 = (byte)uVar4;
          uVar9 = CONCAT11(bVar6,bVar5);
          auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       (histogram.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar7));
          auVar14._4_4_ = (uint)((byte)(uVar9 >> 1) & 1) * auVar17._4_4_;
          auVar14._0_4_ = (uint)(bVar5 & 1) * auVar17._0_4_;
          auVar14._8_4_ = (uint)((byte)(uVar9 >> 2) & 1) * auVar17._8_4_;
          auVar14._12_4_ = (uint)((byte)(uVar9 >> 3) & 1) * auVar17._12_4_;
          auVar14._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * auVar17._16_4_;
          auVar14._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * auVar17._20_4_;
          auVar14._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * auVar17._24_4_;
          auVar14._28_4_ = (uint)((byte)(uVar9 >> 7) & 1) * auVar17._28_4_;
          auVar14._32_4_ = (uint)(bVar6 & 1) * auVar17._32_4_;
          auVar14._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar17._36_4_;
          auVar14._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar17._40_4_;
          auVar14._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar17._44_4_;
          auVar14._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar17._48_4_;
          auVar14._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar17._52_4_;
          auVar14._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar17._56_4_;
          auVar14._60_4_ = (uint)(bVar6 >> 7) * auVar17._60_4_;
          lVar7 = lVar7 + 0x10;
          auVar17 = vpaddd_avx512f(auVar14,auVar15);
        } while (lVar7 != 0x100);
        auVar11 = vmovdqa32_avx512f(auVar17);
        auVar12._0_4_ = (uint)(bVar5 & 1) * auVar11._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar15._0_4_
        ;
        bVar8 = (bool)((byte)(uVar9 >> 1) & 1);
        auVar12._4_4_ = (uint)bVar8 * auVar11._4_4_ | (uint)!bVar8 * auVar15._4_4_;
        bVar8 = (bool)((byte)(uVar9 >> 2) & 1);
        auVar12._8_4_ = (uint)bVar8 * auVar11._8_4_ | (uint)!bVar8 * auVar15._8_4_;
        bVar8 = (bool)((byte)(uVar9 >> 3) & 1);
        auVar12._12_4_ = (uint)bVar8 * auVar11._12_4_ | (uint)!bVar8 * auVar15._12_4_;
        bVar8 = (bool)((byte)(uVar9 >> 4) & 1);
        auVar12._16_4_ = (uint)bVar8 * auVar11._16_4_ | (uint)!bVar8 * auVar15._16_4_;
        bVar8 = (bool)((byte)(uVar9 >> 5) & 1);
        auVar12._20_4_ = (uint)bVar8 * auVar11._20_4_ | (uint)!bVar8 * auVar15._20_4_;
        bVar8 = (bool)((byte)(uVar9 >> 6) & 1);
        auVar12._24_4_ = (uint)bVar8 * auVar11._24_4_ | (uint)!bVar8 * auVar15._24_4_;
        bVar8 = (bool)((byte)(uVar9 >> 7) & 1);
        auVar12._28_4_ = (uint)bVar8 * auVar11._28_4_ | (uint)!bVar8 * auVar15._28_4_;
        auVar12._32_4_ =
             (uint)(bVar6 & 1) * auVar11._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar15._32_4_;
        bVar8 = (bool)(bVar6 >> 1 & 1);
        auVar12._36_4_ = (uint)bVar8 * auVar11._36_4_ | (uint)!bVar8 * auVar15._36_4_;
        bVar8 = (bool)(bVar6 >> 2 & 1);
        auVar12._40_4_ = (uint)bVar8 * auVar11._40_4_ | (uint)!bVar8 * auVar15._40_4_;
        bVar8 = (bool)(bVar6 >> 3 & 1);
        auVar12._44_4_ = (uint)bVar8 * auVar11._44_4_ | (uint)!bVar8 * auVar15._44_4_;
        bVar8 = (bool)(bVar6 >> 4 & 1);
        auVar12._48_4_ = (uint)bVar8 * auVar11._48_4_ | (uint)!bVar8 * auVar15._48_4_;
        bVar8 = (bool)(bVar6 >> 5 & 1);
        auVar12._52_4_ = (uint)bVar8 * auVar11._52_4_ | (uint)!bVar8 * auVar15._52_4_;
        bVar8 = (bool)(bVar6 >> 6 & 1);
        auVar12._56_4_ = (uint)bVar8 * auVar11._56_4_ | (uint)!bVar8 * auVar15._56_4_;
        auVar12._60_4_ =
             (uint)(bVar6 >> 7) * auVar11._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar15._60_4_;
        auVar10 = vextracti64x4_avx512f(auVar12,1);
        auVar11 = vpaddd_avx512f(auVar12,ZEXT3264(auVar10));
        auVar2 = vpaddd_avx(auVar11._0_16_,auVar11._16_16_);
        auVar3 = vpshufd_avx(auVar2,0xee);
        auVar2 = vpaddd_avx(auVar2,auVar3);
        auVar3 = vpshufd_avx(auVar2,0x55);
        auVar2 = vpaddd_avx(auVar2,auVar3);
        uVar16 = auVar2._0_4_;
      }
      bVar8 = uVar16 == histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start
                        [*intensity.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start];
      goto LAB_00151bd1;
    }
  }
  else {
    bVar8 = false;
LAB_00151bd1:
    if (histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_00151bde;
  }
  operator_delete(histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start);
LAB_00151bde:
  if (roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&image);
  if (intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar8;
}

Assistant:

bool form8_Histogram(HistogramForm8 Histogram)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > image = { uniformImage( intensity[0] ), uniformImage( intensity[1] ) };

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( image, roiX, roiY, roiWidth, roiHeight );

        if ( roiHeight / 2 == 0 )
            return true;

        fillImage( image[1], roiX[1], roiY[1], roiWidth, roiHeight / 2, 255 );
        fillImage( image[1], roiX[1], roiY[1] + roiHeight / 2, roiWidth, roiHeight - roiHeight / 2, 0 );

        std::vector < uint32_t > histogram;
        Histogram( image[0], roiX[0], roiY[0], image[1], roiX[1], roiY[1], roiWidth, roiHeight, histogram );

        return histogram.size() == 256u && histogram[intensity[0]] == roiWidth * (roiHeight / 2) &&
            std::accumulate( histogram.begin(), histogram.end(), 0u ) == roiWidth * (roiHeight / 2);
    }